

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O3

void stackjit::Amd64Backend::jumpNotEqual(CodeGen *codeGen,int target)

{
  pointer *ppuVar1;
  iterator iVar2;
  size_t i;
  long lVar3;
  IntToBytes converter;
  uchar local_16;
  uchar local_15;
  uchar local_14 [4];
  
  iVar2._M_current =
       (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (codeGen,iVar2,&local_15);
    iVar2._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    *iVar2._M_current = '\x0f';
    iVar2._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current;
  }
  if (iVar2._M_current ==
      (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (codeGen,iVar2,&local_16);
  }
  else {
    *iVar2._M_current = 0x85;
    ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + 1;
  }
  lVar3 = 0;
  do {
    iVar2._M_current =
         (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)codeGen,iVar2,
                 local_14 + lVar3);
    }
    else {
      *iVar2._M_current = local_14[lVar3];
      ppuVar1 = &(codeGen->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  return;
}

Assistant:

void Amd64Backend::jumpNotEqual(CodeGen& codeGen, int target) {
		IntToBytes converter;
		converter.intValue = target;

		codeGen.push_back(0x0F);
		codeGen.push_back(0x85);

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}